

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O1

bool __thiscall
charls::default_traits<unsigned_char,_charls::quad<unsigned_char>_>::is_near
          (default_traits<unsigned_char,_charls::quad<unsigned_char>_> *this,quad<unsigned_char> lhs
          ,quad<unsigned_char> rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = ((uint)lhs & 0xff) - ((uint)rhs & 0xff);
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = this->near_lossless;
  if (iVar2 <= iVar1) {
    iVar3 = ((uint)lhs >> 8 & 0xff) - ((uint)rhs >> 8 & 0xff);
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    if (iVar2 <= iVar1) {
      iVar3 = ((uint)lhs >> 0x10 & 0xff) - ((uint)rhs >> 0x10 & 0xff);
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      if (iVar2 <= iVar1) {
        iVar3 = ((uint)lhs >> 0x18) - ((uint)rhs >> 0x18);
        iVar2 = -iVar3;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        return iVar2 <= iVar1;
      }
    }
  }
  return false;
}

Assistant:

bool is_near(const quad<SampleType> lhs, const quad<SampleType> rhs) const noexcept
    {
        return std::abs(lhs.v1 - rhs.v1) <= near_lossless && std::abs(lhs.v2 - rhs.v2) <= near_lossless &&
               std::abs(lhs.v3 - rhs.v3) <= near_lossless && std::abs(lhs.v4 - rhs.v4) <= near_lossless;
    }